

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deepExamples.cpp
# Opt level: O1

void writeDeepScanlineFile
               (char *filename,Box2i *displayWindow,Box2i *dataWindow,Array2D<float_*> *dataZ,
               Array2D<Imath_3_2::half_*> *dataA,Array2D<unsigned_int> *sampleCount)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  undefined4 *puVar5;
  long lVar6;
  void *pvVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  long local_140;
  long local_138;
  long local_130;
  DeepScanLineOutputFile file;
  DeepFrameBuffer frameBuffer;
  Header header;
  Slice local_68 [56];
  
  iVar12 = (dataWindow->max).y;
  iVar1 = (dataWindow->min).x;
  iVar2 = (dataWindow->min).y;
  iVar14 = (dataWindow->max).x;
  frameBuffer._map._M_t._M_impl._0_8_ = 0;
  Imf_3_4::Header::Header((Header *)0x3f800000,0x3f800000,&header);
  pcVar4 = (char *)Imf_3_4::Header::channels();
  Imf_3_4::Channel::Channel((Channel *)&frameBuffer,FLOAT,1,1,false);
  Imf_3_4::ChannelList::insert(pcVar4,(Channel *)0x11471a);
  pcVar4 = (char *)Imf_3_4::Header::channels();
  Imf_3_4::Channel::Channel((Channel *)&frameBuffer,HALF,1,1,false);
  Imf_3_4::ChannelList::insert(pcVar4,(Channel *)0x114720);
  Imf_3_4::Header::setType((string *)&header);
  puVar5 = (undefined4 *)Imf_3_4::Header::compression();
  *puVar5 = 2;
  iVar3 = Imf_3_4::globalThreadCount();
  Imf_3_4::DeepScanLineOutputFile::DeepScanLineOutputFile(&file,filename,&header,iVar3);
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Imf_3_4::Slice::Slice(&frameBuffer._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,false,false);
  iVar14 = iVar14 - iVar1;
  lVar10 = (long)(int)((long)iVar14 + 1);
  Imf_3_4::Slice::Slice
            (local_68,UINT,
             (char *)(sampleCount->_data +
                     (-(long)(dataWindow->min).x - (long)(dataWindow->min).y * ((long)iVar14 + 1))),
             4,lVar10 * 4,1,1,0.0,false,false);
  Imf_3_4::DeepFrameBuffer::insertSampleCountSlice((Slice *)&frameBuffer);
  Imf_3_4::DeepSlice::DeepSlice
            ((DeepSlice *)local_68,FLOAT,
             (char *)(dataZ->_data + (-(long)(dataWindow->min).x - (dataWindow->min).y * lVar10)),8,
             lVar10 * 8,4,1,1,0.0,false,false);
  Imf_3_4::DeepFrameBuffer::insert((char *)&frameBuffer,(DeepSlice *)0x11471a);
  Imf_3_4::DeepSlice::DeepSlice
            ((DeepSlice *)local_68,HALF,
             (char *)(dataA->_data + (-(long)(dataWindow->min).x - (dataWindow->min).y * lVar10)),8,
             lVar10 * 8,2,1,1,0.0,false,false);
  Imf_3_4::DeepFrameBuffer::insert((char *)&frameBuffer,(DeepSlice *)0x114720);
  Imf_3_4::DeepScanLineOutputFile::setFrameBuffer((DeepFrameBuffer *)&file);
  iVar12 = iVar12 - iVar2;
  if (-1 < iVar12) {
    local_130 = 0;
    local_138 = 0;
    local_140 = 0;
    uVar8 = 0;
    do {
      if (-1 < iVar14) {
        lVar11 = dataA->_sizeY * local_140;
        lVar9 = sampleCount->_sizeY * local_138;
        lVar15 = dataZ->_sizeY * local_140;
        lVar10 = testDataA._sizeY * local_130;
        lVar6 = testDataZ._sizeY * local_138;
        uVar13 = 0;
        do {
          *(undefined4 *)((long)sampleCount->_data + uVar13 * 4 + lVar9) = 1;
          pvVar7 = operator_new__(4);
          *(void **)((long)dataZ->_data + uVar13 * 8 + lVar15) = pvVar7;
          pvVar7 = operator_new__((ulong)*(uint *)((long)sampleCount->_data + uVar13 * 4 + lVar9) *
                                  2);
          *(void **)((long)dataA->_data + uVar13 * 8 + lVar11) = pvVar7;
          **(undefined4 **)((long)dataZ->_data + uVar13 * 8 + lVar15) =
               *(undefined4 *)((long)testDataZ._data + uVar13 * 4 + lVar6);
          **(uint16_t **)((long)dataA->_data + uVar13 * 8 + lVar11) =
               *(uint16_t *)((long)&testDataA._data[uVar13]._h + lVar10);
          uVar13 = uVar13 + 1;
        } while (iVar14 + 1 != uVar13);
      }
      Imf_3_4::DeepScanLineOutputFile::writePixels((int)&file);
      uVar8 = uVar8 + 1;
      local_140 = local_140 + 8;
      local_138 = local_138 + 4;
      local_130 = local_130 + 2;
    } while (uVar8 != iVar12 + 1);
  }
  if (-1 < iVar12) {
    lVar10 = 0;
    uVar8 = 0;
    do {
      if (-1 < iVar14) {
        uVar13 = 0;
        do {
          pvVar7 = *(void **)((long)dataZ->_data + uVar13 * 8 + dataZ->_sizeY * lVar10);
          if (pvVar7 != (void *)0x0) {
            operator_delete__(pvVar7);
          }
          pvVar7 = *(void **)((long)dataA->_data + uVar13 * 8 + dataA->_sizeY * lVar10);
          if (pvVar7 != (void *)0x0) {
            operator_delete__(pvVar7);
          }
          uVar13 = uVar13 + 1;
        } while (iVar14 + 1 != uVar13);
      }
      uVar8 = uVar8 + 1;
      lVar10 = lVar10 + 8;
    } while (uVar8 != iVar12 + 1);
  }
  std::
  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
               *)&frameBuffer);
  Imf_3_4::DeepScanLineOutputFile::~DeepScanLineOutputFile(&file);
  Imf_3_4::Header::~Header(&header);
  return;
}

Assistant:

void
writeDeepScanlineFile (
    const char       filename[],
    Box2i            displayWindow,
    Box2i            dataWindow,
    Array2D<float*>& dataZ,

    Array2D<half*>& dataA,

    Array2D<unsigned int>& sampleCount)

{
    //
    // Write a deep image with only a A (alpha) and a Z (depth) channel,
    // using class DeepScanLineOutputFile.
    //
    //    - create a file header
    //    - add A and Z channels to the header
    //    - open the file, and store the header in the file
    //    - describe the memory layout of the A and Z pixels
    //    - store the pixels in the file
    //

    int height = dataWindow.max.y - dataWindow.min.y + 1;
    int width  = dataWindow.max.x - dataWindow.min.x + 1;

    Header header (displayWindow, dataWindow);

    header.channels ().insert ("Z", Channel (FLOAT));
    header.channels ().insert ("A", Channel (HALF));
    header.setType (DEEPSCANLINE);
    header.compression () = ZIPS_COMPRESSION;

    DeepScanLineOutputFile file (filename, header);

    DeepFrameBuffer frameBuffer;

    frameBuffer.insertSampleCountSlice (Slice (
        UINT,
        (char*) (&sampleCount[0][0] - dataWindow.min.x -
                 dataWindow.min.y * width),
        sizeof (unsigned int) * 1, // xS

        sizeof (unsigned int) * width)); // yStride

    frameBuffer.insert (
        "Z",
        DeepSlice (
            FLOAT,
            (char*) (&dataZ[0][0] - dataWindow.min.x -
                     dataWindow.min.y * width),
            sizeof (float*) * 1, // xStride for pointer

            sizeof (float*) * width, // yStride for pointer array
            sizeof (float) * 1));    // stride for Z data sample

    frameBuffer.insert (
        "A",
        DeepSlice (
            HALF,
            (char*) (&dataA[0][0] - dataWindow.min.x -
                     dataWindow.min.y * width),
            sizeof (half*) * 1,     // xStride for pointer array
            sizeof (half*) * width, // yStride for pointer array
            sizeof (half) * 1));    // stride for A data sample

    file.setFrameBuffer (frameBuffer);

    for (int i = 0; i < height; i++)
    {
        for (int j = 0; j < width; j++)
        {
            sampleCount[i][j] = getPixelSampleCount (i, j);
            dataZ[i][j]       = new float[sampleCount[i][j]];
            dataA[i][j]       = new half[sampleCount[i][j]];
            // Generate data for dataZ and dataA.
            getPixelSampleData (i, j, dataZ, dataA);
        }

        file.writePixels (1);
    }

    for (int i = 0; i < height; i++)
    {
        for (int j = 0; j < width; j++)
        {
            delete[] dataZ[i][j];
            delete[] dataA[i][j];
        }
    }
}